

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O2

TCascStorage * FreeCascStorage(TCascStorage *hs)

{
  void *__ptr;
  TCascStorage *in_RAX;
  TCascStorage *extraout_RAX;
  long lVar1;
  
  if (hs != (TCascStorage *)0x0) {
    if (hs->pEncryptionKeys != (PCASC_MAP)0x0) {
      Map_Free(hs->pEncryptionKeys);
    }
    CASC_ARRAY::Free(&hs->ExtraKeysList);
    if (hs->pRootHandler != (TRootHandler *)0x0) {
      (*hs->pRootHandler->_vptr_TRootHandler[1])();
    }
    hs->pRootHandler = (TRootHandler *)0x0;
    CASC_ARRAY::Free(&hs->VfsRootList);
    if (hs->pCKeyEntryMap != (PCASC_MAP)0x0) {
      Map_Free(hs->pCKeyEntryMap);
    }
    if (hs->pEKeyEntryMap != (PCASC_MAP)0x0) {
      Map_Free(hs->pEKeyEntryMap);
    }
    free((hs->EncodingData).pbData);
    for (lVar1 = 0x38; lVar1 != 0x138; lVar1 = lVar1 + 1) {
      if ((TFileStream *)(&hs->szClassName)[lVar1] != (TFileStream *)0x0) {
        FileStream_Close((TFileStream *)(&hs->szClassName)[lVar1]);
        (&hs->szClassName)[lVar1] = (char *)0x0;
      }
    }
    for (lVar1 = 0x9e8; lVar1 != 0xd68; lVar1 = lVar1 + 0x38) {
      free(*(void **)((long)hs + lVar1 + -0x28));
      free(*(void **)((long)hs + lVar1 + -0x20));
      __ptr = *(void **)((long)&hs->szClassName + lVar1);
      if ((__ptr != (void *)0x0) && (*(char *)((long)hs + lVar1 + -0xf) == '\x01')) {
        free(__ptr);
      }
      *(undefined8 *)((long)&hs->szClassName + lVar1) = 0;
    }
    free(hs->szDataPath);
    free(hs->szBuildFile);
    free(hs->szIndexPath);
    free(hs->szCdnList);
    FreeCascBlob(&hs->CdnConfigKey);
    FreeCascBlob(&hs->CdnBuildKey);
    FreeCascBlob(&hs->ArchiveGroup);
    FreeCascBlob(&hs->ArchivesKey);
    FreeCascBlob(&hs->PatchArchivesKey);
    FreeCascBlob(&hs->PatchArchivesGroup);
    FreeCascBlob(&hs->BuildFiles);
    free(hs);
    return extraout_RAX;
  }
  return in_RAX;
}

Assistant:

static TCascStorage * FreeCascStorage(TCascStorage * hs)
{
    size_t i;

    if(hs != NULL)
    {
        // Free the keys array
        if(hs->pEncryptionKeys != NULL)
            Map_Free(hs->pEncryptionKeys);
        hs->ExtraKeysList.Free();

        // Free the root handler
        if(hs->pRootHandler != NULL)
            delete hs->pRootHandler;
        hs->pRootHandler = NULL;

        // Free the VFS root list
        hs->VfsRootList.Free();

        // Free the pointers to file entries
        if(hs->pCKeyEntryMap != NULL)
            Map_Free(hs->pCKeyEntryMap);
        if(hs->pEKeyEntryMap != NULL)
            Map_Free(hs->pEKeyEntryMap);
        if(hs->EncodingData.pbData != NULL)
            CASC_FREE(hs->EncodingData.pbData);

        // Close all data files
        for(i = 0; i < CASC_MAX_DATA_FILES; i++)
        {
            if(hs->DataFiles[i] != NULL)
            {
                FileStream_Close(hs->DataFiles[i]);
                hs->DataFiles[i] = NULL;
            }
        }

        // Close all key mappings
        for(i = 0; i < CASC_INDEX_COUNT; i++)
        {
            if(hs->IndexFile[i].szFileName != NULL)
                CASC_FREE(hs->IndexFile[i].szFileName);
            if(hs->IndexFile[i].pbFileData != NULL)
                CASC_FREE(hs->IndexFile[i].pbFileData);
            if(hs->IndexFile[i].pEKeyEntries && hs->IndexFile[i].FreeEKeyEntries)
                CASC_FREE(hs->IndexFile[i].pEKeyEntries);
            hs->IndexFile[i].pEKeyEntries = NULL;
        }

        // Free the file paths
        if(hs->szDataPath != NULL)
            CASC_FREE(hs->szDataPath);
        if(hs->szBuildFile != NULL)
            CASC_FREE(hs->szBuildFile);
        if(hs->szIndexPath != NULL)
            CASC_FREE(hs->szIndexPath);
        if(hs->szCdnList != NULL)
            CASC_FREE(hs->szCdnList);

        // Free the blobs
        FreeCascBlob(&hs->CdnConfigKey);
        FreeCascBlob(&hs->CdnBuildKey);
        
        FreeCascBlob(&hs->ArchiveGroup);
        FreeCascBlob(&hs->ArchivesKey);
        FreeCascBlob(&hs->PatchArchivesKey);
        FreeCascBlob(&hs->PatchArchivesGroup);
        FreeCascBlob(&hs->BuildFiles);

        // Free the storage structure
        hs->szClassName = NULL;
        CASC_FREE(hs);
    }

    return NULL;
}